

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Base *pBVar4;
  Base *dest;
  byte bVar5;
  char *__s1;
  undefined1 auVar6 [16];
  DNASlice slc;
  DNASlice slc2;
  DNASlice local_38;
  
  if (argc == 2) {
    __s1 = argv[1];
    iVar2 = strcmp(__s1,"test");
    if (iVar2 == 0) {
      gTester._failures = 0;
      pBVar4 = (Base *)operator_new__(0x28);
      DNA::fromCStr(pBVar4,10,"AATG");
      printf("Got the DNA ");
      DNA::print(pBVar4,10);
      iVar2 = puts(" .");
      auVar6._0_4_ = -(uint)(*pBVar4 == A);
      auVar6._4_4_ = -(uint)(pBVar4[1] == A);
      auVar6._8_4_ = -(uint)(pBVar4[2] == T);
      auVar6._12_4_ = -(uint)(pBVar4[3] == G);
      uVar3 = movmskps(iVar2,auVar6);
      bVar5 = (byte)(uVar3 ^ 0xf);
      gTester._failures =
           (uint)(bVar5 >> 3) + (uint)((bVar5 & 4) >> 2) + (uint)((bVar5 & 2) >> 1) +
           ((uVar3 ^ 0xf) & 1) + gTester._failures;
      operator_delete__(pBVar4);
      pBVar4 = (Base *)operator_new__(0x28);
      dest = (Base *)operator_new__(0x10);
      DNA::fromCStr(pBVar4,10,"AATTGGCCAA");
      DNA::fromCStr(dest,4,"CCAA");
      bVar1 = DNA::contains(pBVar4,10,dest,4);
      gTester._failures = gTester._failures + !bVar1;
      operator_delete__(pBVar4);
      operator_delete__(dest);
      DNASlice::DNASlice(&slc,"AGCCT");
      DNASlice::DNASlice(&slc2,"ACGTT");
      DNASlice::DNASlice(&local_38,"ACGTT");
      TestObject::eq<DNASlice>(&gTester,&local_38,&slc2);
      bVar1 = DNASlice::operator==(&slc,&slc2);
      gTester._failures = gTester._failures + bVar1;
      DNASlice::~DNASlice(&local_38);
      DNASlice::~DNASlice(&slc2);
      DNASlice::~DNASlice(&slc);
      TestObject::finish(&gTester);
      __s1 = argv[1];
    }
    iVar2 = strcmp(__s1,"show");
    if (iVar2 == 0) {
      DNASlice::DNASlice(&slc,"aggctca");
      printf("Created DNA slice: ");
      DNASlice::print(&slc);
      putc(10,_stdout);
      printf("Created a DNA view: ");
      DNA::print(slc._dna,slc._size - 2);
      putc(10,_stdout);
      DNASlice::~DNASlice(&slc);
    }
    return 0;
  }
  fprintf(_stderr,"Must specify mode, got %d args\n",(ulong)(uint)argc);
  exit(2);
}

Assistant:

int main(int argc, char const* argv[]) {
	if (argc != 2) {
		std::fprintf(stderr, "Must specify mode, got %d args\n", argc);
		std::exit(2);
	}
	
	if (std::strcmp(argv[1], "test") == 0) {
		gTester.clear();
		testfromCStr();
		testContains();
		testDNASlice();
		gTester.finish();
	}
	
	if (std::strcmp(argv[1], "show") == 0) {
		DNASlice s1("aggctca");
		std::printf("Created DNA slice: ");
		s1.print();
		std::putc('\n', stdout);
		DNAView v1(s1.dna(), s1.size() - 2);
		std::printf("Created a DNA view: ");
		DNA::print(v1.dna(), v1.size());
		std::putc('\n', stdout);
		
	}
	return 0;
}